

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitTableFill(BinaryInstWriter *this,TableFill *curr)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  BufferWithRandomAccess *pBVar1;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  LEB<unsigned_int,_unsigned_char> local_2c;
  LEB<unsigned_int,_unsigned_char> local_28;
  uchar local_21;
  
  this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  local_21 = 0xfc;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_00,&local_21);
  local_28.value = 0x11;
  LEB<unsigned_int,_unsigned_char>::write(&local_28,(int)this_00,__buf,in_RCX);
  pBVar1 = this->o;
  local_2c.value =
       WasmBinaryWriter::getTableIndex(this->parent,(Name)(curr->table).super_IString.str);
  LEB<unsigned_int,_unsigned_char>::write(&local_2c,(int)pBVar1,__buf_00,in_RCX);
  return;
}

Assistant:

void BinaryInstWriter::visitTableFill(TableFill* curr) {
  o << int8_t(BinaryConsts::MiscPrefix) << U32LEB(BinaryConsts::TableFill);
  o << U32LEB(parent.getTableIndex(curr->table));
}